

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O1

void __thiscall OpenMD::StuntDouble::setPrevA(StuntDouble *this,RotMat3x3d *a)

{
  double (*padVar1) [3];
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  
  padVar1 = (double (*) [3])
            ((long)this->localIndex_ * 0x48 +
            *(long *)((long)&(this->snapshotMan_->previousSnapshot_->atomData).aMat.
                             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + this->storage_));
  if ((RotMat3x3d *)padVar1 != a) {
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar1)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar3] =
             (((SquareMatrix<double,_3> *)*(double (*) [3])a)->super_RectMatrix<double,_3U,_3U>).
             data_[0][lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      lVar2 = lVar2 + 1;
      padVar1 = padVar1 + 1;
      a = (RotMat3x3d *)((long)a + 0x18);
    } while (lVar2 != 3);
  }
  return;
}

Assistant:

virtual void setPrevA(const RotMat3x3d& a) {
      ((snapshotMan_->getPrevSnapshot())->*storage_).aMat[localIndex_] = a;
    }